

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O3

int Gia_ManMultiProve(Gia_Man_t *p,Bmc_MulPar_t *pPars)

{
  uint uVar1;
  int iVar2;
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  pVVar3 = p->vSeqModelVec;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar2 = pVVar3->nSize;
    if (0 < iVar2) {
      lVar6 = 0;
      do {
        if ((void *)0x2 < pVVar3->pArray[lVar6]) {
          free(pVVar3->pArray[lVar6]);
          iVar2 = pVVar3->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar2);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
    p->vSeqModelVec = (Vec_Ptr_t *)0x0;
  }
  uVar5 = 0;
  p_00 = Gia_ManToAig(p,0);
  pVVar3 = Gia_ManMultiProveAig(p_00,pPars);
  p->vSeqModelVec = pVVar3;
  uVar1 = pVVar3->nSize;
  if (uVar1 == p->vCos->nSize - p->nRegs) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      uVar5 = 0;
      do {
        uVar5 = uVar5 + (pVVar3->pArray[uVar4] == (void *)0x0);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    return -(uint)(uVar5 == uVar1);
  }
  __assert_fail("Vec_PtrSize(p->vSeqModelVec) == Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMulti.c"
                ,0x11e,"int Gia_ManMultiProve(Gia_Man_t *, Bmc_MulPar_t *)");
}

Assistant:

int Gia_ManMultiProve( Gia_Man_t * p, Bmc_MulPar_t * pPars )
{
    Aig_Man_t * pAig;
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec ), p->vSeqModelVec = NULL;
    pAig = Gia_ManToAig( p, 0 );
    p->vSeqModelVec = Gia_ManMultiProveAig( pAig, pPars ); // deletes pAig
    assert( Vec_PtrSize(p->vSeqModelVec) == Gia_ManPoNum(p) );
    return Vec_PtrCountZero(p->vSeqModelVec) == Vec_PtrSize(p->vSeqModelVec) ? -1 : 0;
}